

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLGrammarPoolImpl.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLGrammarPoolImpl::unlockPool(XMLGrammarPoolImpl *this)

{
  XSModel *this_00;
  void *in_RSI;
  XMLGrammarPoolImpl *this_local;
  
  if ((this->fLocked & 1U) != 0) {
    this->fLocked = false;
    if (this->fSynchronizedStringPool != (XMLSynchronizedStringPool *)0x0) {
      (*(this->fSynchronizedStringPool->super_XMLStringPool).super_XSerializable._vptr_XSerializable
        [8])();
      if (this->fSynchronizedStringPool != (XMLSynchronizedStringPool *)0x0) {
        (*(this->fSynchronizedStringPool->super_XMLStringPool).super_XSerializable.
          _vptr_XSerializable[1])();
      }
      this->fSynchronizedStringPool = (XMLSynchronizedStringPool *)0x0;
    }
    this->fXSModelIsValid = false;
    if (this->fXSModel != (XSModel *)0x0) {
      this_00 = this->fXSModel;
      if (this_00 != (XSModel *)0x0) {
        XSModel::~XSModel(this_00);
        XMemory::operator_delete((XMemory *)this_00,in_RSI);
      }
      this->fXSModel = (XSModel *)0x0;
    }
  }
  return;
}

Assistant:

void XMLGrammarPoolImpl::unlockPool()
{
    if (fLocked)
    {
        fLocked = false;
        if(fSynchronizedStringPool)
        {
            fSynchronizedStringPool->flushAll();
            // if user calls Lock again, need to have null fSynchronizedStringPool
            delete fSynchronizedStringPool;
            fSynchronizedStringPool = 0;
        }
        fXSModelIsValid = false;
        if (fXSModel)
        {
            delete fXSModel;
            fXSModel = 0;
        }
    }
}